

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptObject.cpp
# Opt level: O2

Var Js::JavascriptObject::GetToStringTagValue
              (RecyclableObject *thisArg,ScriptContext *scriptContext)

{
  ScriptContextPolymorphicInlineCache *polymorphicInlineCache;
  bool bVar1;
  undefined1 local_70 [8];
  PropertyValueInfo info;
  Var value;
  
  bVar1 = JavascriptOperators::CheckIfObjectAndProtoChainHasNoSpecialProperties(thisArg);
  if (bVar1) {
    info._56_8_ = (Var)0x0;
  }
  else {
    polymorphicInlineCache =
         (((scriptContext->super_ScriptContextBase).javascriptLibrary)->cache).toStringTagCache.ptr;
    local_70 = (undefined1  [8])0x0;
    info.m_instance = (RecyclableObject *)0x50000ffff;
    info.m_propertyIndex = 0;
    info.m_attributes = '\0';
    info.flags = InlineCacheNoFlags;
    info.cacheInfoFlag = 0;
    info.inlineCache = (InlineCache *)0x0;
    info.polymorphicInlineCache = (PolymorphicInlineCache *)0x0;
    info.functionBody = (FunctionBody *)0x0;
    info.prop = (RecyclableObject *)0x0;
    info.propertyRecordUsageCache._0_4_ = 0xffffffff;
    info.propertyRecordUsageCache._5_1_ = 1;
    PropertyValueInfo::SetCacheInfo
              ((PropertyValueInfo *)local_70,&polymorphicInlineCache->super_PolymorphicInlineCache,
               false);
    bVar1 = CacheOperators::TryGetProperty<true,true,true,true,true,true,false,true,false,false>
                      (thisArg,false,thisArg,0x1b,(Var *)&info.inlineCacheIndex,scriptContext,
                       (PropertyCacheOperationInfo *)0x0,(PropertyValueInfo *)local_70);
    if (!bVar1) {
      bVar1 = Phases::IsEnabled((Phases *)&DAT_01453738,InlineCachePhase);
      if ((bVar1) && (DAT_0145948a == '\x01')) {
        CacheOperators::TraceCache
                  (&polymorphicInlineCache->super_PolymorphicInlineCache,L"PatchGetValue",0x1b,
                   scriptContext,thisArg);
      }
      info._56_8_ = JavascriptOperators::GetProperty
                              (thisArg,thisArg,0x1b,scriptContext,(PropertyValueInfo *)local_70);
    }
  }
  return (Var)info._56_8_;
}

Assistant:

Var JavascriptObject::GetToStringTagValue(RecyclableObject *thisArg, ScriptContext *scriptContext)
{
    if (JavascriptOperators::CheckIfObjectAndProtoChainHasNoSpecialProperties(thisArg))
    {
        return nullptr;
    }

    const PropertyId toStringTagId(PropertyIds::_symbolToStringTag);
    PolymorphicInlineCache *cache = scriptContext->GetLibrary()->GetToStringTagCache();
    PropertyValueInfo info;
    // We don't allow cache resizing, at least for the moment: it's more work, and since there's only one
    // cache per script context, we can afford to create each cache with the maximum size.
    PropertyValueInfo::SetCacheInfo(&info, cache, false);
    Var value;
    if (CacheOperators::TryGetProperty<
        true,                                       // CheckLocal
        true,                                       // CheckProto
        true,                                       // CheckAccessor
        true,                                       // CheckMissing
        true,                                       // CheckPolymorphicInlineCache
        true,                                       // CheckTypePropertyCache
        !PolymorphicInlineCache::IsPolymorphic,     // IsInlineCacheAvailable
        PolymorphicInlineCache::IsPolymorphic,      // IsPolymorphicInlineCacheAvailable
        false,                                      // ReturnOperationInfo
        false>                                      // OutputExistence
        (thisArg, false, thisArg, toStringTagId, &value, scriptContext, nullptr, &info))
    {
        return value;
    }
    else
    {
#if DBG_DUMP
        if (PHASE_VERBOSE_TRACE1(Js::InlineCachePhase))
        {
            CacheOperators::TraceCache(cache, _u("PatchGetValue"), toStringTagId, scriptContext, thisArg);
        }
#endif
        return JavascriptOperators::GetProperty(thisArg, thisArg, toStringTagId, scriptContext, &info);
    }
}